

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_import.cpp
# Opt level: O3

void __thiscall
ComponentImport_notUniqueImportName_Test::~ComponentImport_notUniqueImportName_Test
          (ComponentImport_notUniqueImportName_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ComponentImport, notUniqueImportName)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"http://someplace.world/cellml/model.xml\">\n"
        "    <component component_ref=\"holey\" name=\"bob\"/>\n"
        "    <component component_ref=\"moley\" name=\"bob\"/>\n"
        "  </import>\n"
        "</model>\n";

    libcellml::ParserPtr p = libcellml::Parser::create();
    libcellml::ValidatorPtr v = libcellml::Validator::create();

    libcellml::ModelPtr m = p->parseModel(in);

    EXPECT_EQ(size_t(0), p->errorCount());

    v->validateModel(m);

    EXPECT_EQ(size_t(1), v->errorCount());
    EXPECT_EQ("Model 'model' contains multiple components with the name 'bob'. Valid component names must be unique to their model.", v->error(0)->description());
}